

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number lua_tonumberx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  undefined4 *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue tmp;
  cTValue *o;
  TValue *in_stack_ffffffffffffffc8;
  TValue *local_10;
  
  local_10 = index2adr(in_RDI,in_ESI);
  if ((local_10->field_2).it < 0xffff0000) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 1;
    }
    local_10 = (TValue *)local_10->u64;
  }
  else if (((local_10->field_2).it == 0xfffffffb) &&
          (iVar1 = lj_strscan_num((GCstr *)&local_10->field_2,in_stack_ffffffffffffffc8), iVar1 != 0
          )) {
    local_10 = in_stack_ffffffffffffffc8;
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 1;
    }
  }
  else {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
    local_10 = (TValue *)0x0;
  }
  return (lua_Number)local_10;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o))) {
    if (ok) *ok = 1;
    return numberVnum(o);
  } else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp)) {
    if (ok) *ok = 1;
    return numV(&tmp);
  } else {
    if (ok) *ok = 0;
    return 0;
  }
}